

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void open_blocked_streams(quicly_conn_t *conn,int uni)

{
  ulong uVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  long *plVar5;
  anon_struct_80_2_8a8f9515_for_max_streams *paVar6;
  uint64_t *puVar7;
  bool bVar8;
  
  bVar8 = uni == 0;
  paVar6 = &(conn->egress).max_streams;
  if (bVar8) {
    paVar6 = (anon_struct_80_2_8a8f9515_for_max_streams *)&(conn->egress).max_streams.bidi;
  }
  puVar7 = (conn->egress).retire_cid.sequences + (ulong)bVar8 * 2 + -7;
  uVar1 = (paVar6->uni).count;
  while( true ) {
    if ((uint64_t *)*puVar7 == puVar7) {
      return;
    }
    plVar2 = (long *)(conn->egress).retire_cid.sequences[(ulong)bVar8 * 2 + -6];
    uVar3 = plVar2[-0x1f];
    if (uVar1 <= (ulong)((long)uVar3 / 4)) break;
    if ((*(byte *)(plVar2 + -9) & 1) == 0) {
      __assert_fail("stream->streams_blocked",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0xe86,"void open_blocked_streams(quicly_conn_t *, int)");
    }
    lVar4 = *plVar2;
    plVar5 = (long *)plVar2[1];
    *(long **)(lVar4 + 8) = plVar5;
    *plVar5 = lVar4;
    plVar2[1] = (long)plVar2;
    *plVar2 = (long)plVar2;
    *(byte *)(plVar2 + -9) = *(byte *)(plVar2 + -9) & 0xfe;
    plVar2[-8] = *(long *)((conn->super).original_dcid.cid +
                          (ulong)((uVar3 & 0x8000000000000002) == 2) * 8 + -0x70);
    sched_stream_control((quicly_stream_t *)(plVar2 + -0x20));
    resched_stream_data((quicly_stream_t *)(plVar2 + -0x20));
  }
  return;
}

Assistant:

static void open_blocked_streams(quicly_conn_t *conn, int uni)
{
    uint64_t count;
    quicly_linklist_t *anchor;

    if (uni) {
        count = conn->egress.max_streams.uni.count;
        anchor = &conn->egress.pending_streams.blocked.uni;
    } else {
        count = conn->egress.max_streams.bidi.count;
        anchor = &conn->egress.pending_streams.blocked.bidi;
    }

    while (quicly_linklist_is_linked(anchor)) {
        quicly_stream_t *stream = (void *)((char *)anchor->next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
        if (stream->stream_id / 4 >= count)
            break;
        assert(stream->streams_blocked);
        quicly_linklist_unlink(&stream->_send_aux.pending_link.control);
        stream->streams_blocked = 0;
        stream->_send_aux.max_stream_data = quicly_stream_is_unidirectional(stream->stream_id)
                                                ? conn->super.remote.transport_params.max_stream_data.uni
                                                : conn->super.remote.transport_params.max_stream_data.bidi_remote;
        /* TODO retain separate flags for stream states so that we do not always need to sched for both control and data */
        sched_stream_control(stream);
        resched_stream_data(stream);
    }
}